

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

string * __thiscall
jsonnet::internal::(anonymous_namespace)::type_str_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type t)

{
  string *extraout_RAX;
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = (int)this;
  if (iVar3 < 0x10) {
    if (iVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "null";
      pcVar2 = "";
    }
    else if (iVar3 == 1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "boolean";
      pcVar2 = "";
    }
    else {
      if (iVar3 != 2) goto switchD_00176039_default;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "number";
      pcVar2 = "";
    }
  }
  else {
    switch(iVar3) {
    case 0x10:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "array";
      pcVar2 = "";
      break;
    case 0x11:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "function";
      pcVar2 = "";
      break;
    case 0x12:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "object";
      pcVar2 = "";
      break;
    case 0x13:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "string";
      pcVar2 = "";
      break;
    default:
switchD_00176039_default:
      poVar1 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown type: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      abort();
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar2);
  return extraout_RAX;
}

Assistant:

std::string type_str(Value::Type t)
{
    switch (t) {
        case Value::NULL_TYPE: return "null";
        case Value::BOOLEAN: return "boolean";
        case Value::NUMBER: return "number";
        case Value::ARRAY: return "array";
        case Value::FUNCTION: return "function";
        case Value::OBJECT: return "object";
        case Value::STRING: return "string";
        default:
            std::cerr << "INTERNAL ERROR: Unknown type: " << t << std::endl;
            std::abort();
            return "";  // Quiet, compiler.
    }
}